

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O3

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  _func_int_int_char_ptr_ptr *callBack)

{
  pointer pcVar1;
  argParserAdvancedConfiguration *paVar2;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  string local_88;
  string local_68;
  string local_48;
  
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/src/argvParser.cpp:72:47)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/src/argvParser.cpp:72:47)>
             ::_M_manager;
  pcVar1 = (argvShort->_M_dataplus)._M_p;
  local_c8._M_unused._0_8_ = (undefined8)callBack;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + argvShort->_M_string_length);
  pcVar1 = (argvLong->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + argvLong->_M_string_length);
  pcVar1 = (help->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + help->_M_string_length);
  std::function<int_(int,_char_**)>::function
            ((function<int_(int,_char_**)> *)&local_a8,(function<int_(int,_char_**)> *)&local_c8);
  paVar2 = addArg(this,&local_48,&local_68,&local_88,(function<int_(int,_char_**)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  return paVar2;
}

Assistant:

argParserAdvancedConfiguration * argvParser::addArg(string argvShort, string argvLong, string help, int (*callBack)(int, char **)) {
    function<int(int, char **)> tmpCallback = [callBack](int i, char **argv) { return callBack(i, argv); };
    return addArg(argvShort, argvLong, help, tmpCallback);
}